

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

int acmod_set_s2_parse_triphone
              (acmod_set_t *acmod_set,acmod_id_t *base,acmod_id_t *left,acmod_id_t *right,
              word_posn_t *posn,char *str)

{
  acmod_id_t aVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  char *pmap;
  uint32 i;
  char *save;
  char *tok;
  char *str_local;
  word_posn_t *posn_local;
  acmod_id_t *right_local;
  acmod_id_t *left_local;
  acmod_id_t *base_local;
  acmod_set_t *acmod_set_local;
  
  __s = strdup(str);
  pcVar2 = strtok(__s,"(,)");
  aVar1 = acmod_set_name2id(acmod_set,pcVar2);
  *base = aVar1;
  if (*base != 0xffffffff) {
    pcVar2 = strtok((char *)0x0,"(,)");
    aVar1 = acmod_set_name2id(acmod_set,pcVar2);
    *left = aVar1;
    if (*left != 0xffffffff) {
      pcVar2 = strtok((char *)0x0,"(,)");
      aVar1 = acmod_set_name2id(acmod_set,pcVar2);
      *right = aVar1;
      if (*right != 0xffffffff) {
        pcVar2 = strtok((char *)0x0,"(,)");
        if (pcVar2 == (char *)0x0) {
          *posn = WORD_POSN_INTERNAL;
        }
        else {
          for (pmap._4_4_ = WORD_POSN_BEGIN;
              (sVar3 = strlen("besiu"), pmap._4_4_ < sVar3 && (*pcVar2 != "besiu"[pmap._4_4_]));
              pmap._4_4_ = pmap._4_4_ + WORD_POSN_END) {
          }
          sVar3 = strlen("besiu");
          if (pmap._4_4_ < sVar3) {
            *posn = pmap._4_4_;
          }
          if (*pcVar2 == '<') {
            *posn = WORD_POSN_INTERNAL;
          }
        }
        free(__s);
        return 0;
      }
    }
  }
  free(__s);
  return -1;
}

Assistant:

int
acmod_set_s2_parse_triphone(acmod_set_t *acmod_set,
			    acmod_id_t *base,
			    acmod_id_t *left,
			    acmod_id_t *right,
			    word_posn_t *posn,
			    char *str)
{
    char *tok;
    char *save;
    uint32 i;
    char *pmap = WORD_POSN_CHAR_MAP;

    save = strdup(str);

    tok = strtok(save, "(,)");
    *base = acmod_set_name2id(acmod_set, tok);
    if (*base == NO_ACMOD)
	goto error;

    tok = strtok(NULL, "(,)");
    *left = acmod_set_name2id(acmod_set, tok);
    if (*left == NO_ACMOD)
	goto error;

    tok = strtok(NULL, "(,)");
    *right = acmod_set_name2id(acmod_set, tok);
    if (*right == NO_ACMOD)
	goto error;

    tok = strtok(NULL, "(,)");
    if (tok) {
	for (i = 0; i < strlen(pmap); i++) {
	    if (tok[0] == pmap[i])
		break;
	}

	if (i < strlen(pmap))
	    *posn = (word_posn_t)i;

	/* hack for parsing seno mapping files */
	if (tok[0] == '<')
	    *posn = WORD_POSN_INTERNAL;
    }
    else {
	*posn = WORD_POSN_INTERNAL;
    }
    
    free(save);
    return S3_SUCCESS;

error:
    free(save);
    return S3_ERROR;
}